

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void printTestUsage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "usage: fasttext test <model> <test-data> [<k>]\n\n");
  poVar1 = std::operator<<(poVar1,"  <model>      model filename\n");
  poVar1 = std::operator<<(poVar1,"  <test-data>  test data filename (if -, read from stdin)\n");
  poVar1 = std::operator<<(poVar1,"  <k>          (optional; 1 by default) predict top k labels\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printTestUsage() {
  std::cout
    << "usage: fasttext test <model> <test-data> [<k>]\n\n"
    << "  <model>      model filename\n"
    << "  <test-data>  test data filename (if -, read from stdin)\n"
    << "  <k>          (optional; 1 by default) predict top k labels\n"
    << std::endl;
}